

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildValue.h
# Opt level: O2

void __thiscall llbuild::buildsystem::BuildValue::BuildValue(BuildValue *this,BuildValue *rhs)

{
  uint uVar1;
  FileInfo *pFVar2;
  FileInfo *pFVar3;
  long lVar4;
  long lVar5;
  uint8_t *puVar6;
  anon_union_80_2_ecfed234_for_valueData *paVar7;
  uint8_t *puVar8;
  anon_union_80_2_ecfed234_for_valueData *paVar9;
  ulong uVar10;
  byte bVar11;
  ArrayRef<llvm::StringRef> values;
  StringList local_50;
  _Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_> local_40;
  
  bVar11 = 0;
  this->kind = Invalid;
  uVar1 = rhs->numOutputInfos;
  this->numOutputInfos = uVar1;
  (this->signature).value = 0;
  (this->valueData).asOutputInfo.device = 0;
  (this->valueData).asOutputInfo.inode = 0;
  (this->valueData).asOutputInfo.mode = 0;
  (this->valueData).asOutputInfo.size = 0;
  (this->valueData).asOutputInfo.modTime.seconds = 0;
  (this->valueData).asOutputInfo.modTime.nanoseconds = 0;
  *(undefined8 *)((long)&this->valueData + 0x30) = 0;
  (this->stringValues).size = 0;
  *(undefined8 *)((long)&this->valueData + 0x38) = 0;
  *(undefined8 *)((long)&this->valueData + 0x40) = 0;
  *(undefined8 *)((long)&this->valueData + 0x48) = 0;
  (this->stringValues).contents = (char *)0x0;
  this->kind = rhs->kind;
  (this->signature).value = (rhs->signature).value;
  if (rhs->numOutputInfos < 2) {
    paVar7 = &rhs->valueData;
    paVar9 = &this->valueData;
    for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
      (paVar9->asOutputInfo).device = (paVar7->asOutputInfo).device;
      paVar7 = (anon_union_80_2_ecfed234_for_valueData *)((long)paVar7 + 8);
      paVar9 = (anon_union_80_2_ecfed234_for_valueData *)((long)paVar9 + 8);
    }
  }
  else {
    uVar10 = (ulong)uVar1 * 0x50;
    pFVar3 = (FileInfo *)operator_new__(uVar10);
    if ((ulong)uVar1 != 0) {
      lVar5 = 0;
      do {
        puVar6 = (pFVar3->checksum).bytes + lVar5 + 0x10;
        puVar6[0] = '\0';
        puVar6[1] = '\0';
        puVar6[2] = '\0';
        puVar6[3] = '\0';
        puVar6[4] = '\0';
        puVar6[5] = '\0';
        puVar6[6] = '\0';
        puVar6[7] = '\0';
        puVar6[8] = '\0';
        puVar6[9] = '\0';
        puVar6[10] = '\0';
        puVar6[0xb] = '\0';
        puVar6[0xc] = '\0';
        puVar6[0xd] = '\0';
        puVar6[0xe] = '\0';
        puVar6[0xf] = '\0';
        puVar6 = (pFVar3->checksum).bytes + lVar5;
        puVar6[0] = '\0';
        puVar6[1] = '\0';
        puVar6[2] = '\0';
        puVar6[3] = '\0';
        puVar6[4] = '\0';
        puVar6[5] = '\0';
        puVar6[6] = '\0';
        puVar6[7] = '\0';
        puVar6[8] = '\0';
        puVar6[9] = '\0';
        puVar6[10] = '\0';
        puVar6[0xb] = '\0';
        puVar6[0xc] = '\0';
        puVar6[0xd] = '\0';
        puVar6[0xe] = '\0';
        puVar6[0xf] = '\0';
        lVar5 = lVar5 + 0x50;
      } while (uVar10 - lVar5 != 0);
    }
    pFVar2 = (rhs->valueData).asOutputInfos;
    for (lVar5 = 0; uVar10 - lVar5 != 0; lVar5 = lVar5 + 0x50) {
      puVar6 = (pFVar2->checksum).bytes + lVar5 + -0x30;
      puVar8 = (pFVar3->checksum).bytes + lVar5 + -0x30;
      for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
        *(undefined8 *)puVar8 = *(undefined8 *)puVar6;
        puVar6 = puVar6 + ((ulong)bVar11 * -2 + 1) * 8;
        puVar8 = puVar8 + ((ulong)bVar11 * -2 + 1) * 8;
      }
    }
    (this->valueData).asOutputInfos = pFVar3;
  }
  if ((rhs->kind < SuccessfulCommandWithOutputSignature) &&
     ((0x10090U >> (rhs->kind & (FilteredDirectoryContents|Target)) & 1) != 0)) {
    llbuild::basic::StringList::getValues
              ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&local_40,
               &rhs->stringValues);
    values.Length =
         (long)local_40._M_impl.super__Vector_impl_data._M_finish -
         (long)local_40._M_impl.super__Vector_impl_data._M_start >> 4;
    values.Data = local_40._M_impl.super__Vector_impl_data._M_start;
    llbuild::basic::StringList::StringList<llvm::StringRef>(&local_50,values);
    llbuild::basic::StringList::operator=(&this->stringValues,&local_50);
    llbuild::basic::StringList::~StringList(&local_50);
    std::_Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>::~_Vector_base(&local_40);
  }
  return;
}

Assistant:

explicit BuildValue(const BuildValue& rhs) : numOutputInfos(rhs.numOutputInfos) {
    kind = rhs.kind;
    signature = rhs.signature;
    if (rhs.hasMultipleOutputs()) {
      auto newOutputInfos = new FileInfo[numOutputInfos];
      for (uint32_t i = 0; i < numOutputInfos; ++i) {
        newOutputInfos[i] = rhs.valueData.asOutputInfos[i];
      }
      valueData.asOutputInfos = newOutputInfos;
    } else {
      valueData.asOutputInfo = rhs.valueData.asOutputInfo;
    }

    if (rhs.kindHasStringList()) {
      stringValues = basic::StringList(ArrayRef<StringRef>(rhs.stringValues.getValues()));
    }
  }